

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromMemory
              (EXRHeader *exr_header,EXRVersion *version,uchar *memory,size_t size,char **err)

{
  bool bVar1;
  ulong uVar2;
  HeaderInfo *pHVar3;
  reference pvVar4;
  ulong in_RCX;
  string *in_RDX;
  string *in_RSI;
  HeaderInfo *in_RDI;
  long in_R8;
  size_t i;
  string err_str_1;
  string warn;
  string err_str;
  int ret;
  HeaderInfo info;
  size_t marker_size;
  uchar *marker;
  size_t in_stack_00000410;
  uchar *in_stack_00000418;
  string *in_stack_00000420;
  EXRVersion *in_stack_00000428;
  bool *in_stack_00000430;
  HeaderInfo *in_stack_00000438;
  char **in_stack_fffffffffffffdd8;
  HeaderInfo *in_stack_fffffffffffffde0;
  HeaderInfo *local_1d8;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [36];
  int local_16c;
  vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> avStack_150 [7];
  long local_a0;
  size_type *local_98;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  long local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDX == (string *)0x0) || (in_RDI == (HeaderInfo *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "Invalid argument. `memory` or `exr_header` argument is null in ParseEXRHeaderFromMemory()"
               ,&local_51);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_16c = -3;
  }
  else if (in_RCX < 8) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Insufficient header/data size.\n",&local_89);
    tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    local_16c = -4;
  }
  else {
    local_98 = &in_RDX->_M_string_length;
    local_a0 = in_RCX - 8;
    local_30 = in_R8;
    tinyexr::HeaderInfo::HeaderInfo(in_stack_fffffffffffffde0);
    tinyexr::HeaderInfo::clear(in_stack_fffffffffffffde0);
    std::__cxx11::string::string(local_190);
    local_16c = tinyexr::ParseEXRHeader
                          (in_stack_00000438,in_stack_00000430,in_stack_00000428,in_stack_00000420,
                           in_stack_00000418,in_stack_00000410);
    if (((local_16c != 0) && (local_30 != 0)) &&
       (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
      tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    }
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::string(local_1b0);
    std::__cxx11::string::string(local_1d0);
    bVar1 = tinyexr::ConvertHeader
                      ((EXRHeader *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,in_RSI,in_RDX);
    if (!bVar1) {
      local_1d8 = (HeaderInfo *)0x0;
      while (in_stack_fffffffffffffde0 = local_1d8,
            pHVar3 = (HeaderInfo *)
                     std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size(avStack_150),
            in_stack_fffffffffffffde0 < pHVar3) {
        pvVar4 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                           (avStack_150,(size_type)local_1d8);
        if (pvVar4->value != (uchar *)0x0) {
          pvVar4 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                             (avStack_150,(size_type)local_1d8);
          free(pvVar4->value);
        }
        local_1d8 = (HeaderInfo *)
                    ((long)&(local_1d8->channels).
                            super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
      }
      if ((local_30 != 0) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        tinyexr::SetErrorMessage((string *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      }
      local_16c = -9;
    }
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1b0);
    in_RDI->screen_window_center[0] = (float)(uint)(*(int *)&in_RSI->field_2 != 0);
    (in_RDI->display_window).max_y = (uint)(*(int *)((long)&in_RSI->_M_string_length + 4) != 0);
    tinyexr::HeaderInfo::~HeaderInfo(in_stack_fffffffffffffde0);
  }
  return local_16c;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRHeader *exr_header, const EXRVersion *version,
                             const unsigned char *memory, size_t size,
                             const char **err) {
  if (memory == NULL || exr_header == NULL) {
    tinyexr::SetErrorMessage(
        "Invalid argument. `memory` or `exr_header` argument is null in "
        "ParseEXRHeaderFromMemory()",
        err);

    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (size < tinyexr::kEXRVersionSize) {
    tinyexr::SetErrorMessage("Insufficient header/data size.\n", err);
    return TINYEXR_ERROR_INVALID_DATA;
  }

  const unsigned char *marker = memory + tinyexr::kEXRVersionSize;
  size_t marker_size = size - tinyexr::kEXRVersionSize;

  tinyexr::HeaderInfo info;
  info.clear();

  int ret;
  {
    std::string err_str;
    ret = ParseEXRHeader(&info, NULL, version, &err_str, marker, marker_size);

    if (ret != TINYEXR_SUCCESS) {
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
    }
  }

  {
    std::string warn;
    std::string err_str;

    if (!ConvertHeader(exr_header, info, &warn, &err_str)) {
      // release mem
      for (size_t i = 0; i < info.attributes.size(); i++) {
        if (info.attributes[i].value) {
          free(info.attributes[i].value);
        }
      }
      if (err && !err_str.empty()) {
        tinyexr::SetErrorMessage(err_str, err);
      }
      ret = TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  exr_header->multipart = version->multipart ? 1 : 0;
  exr_header->non_image = version->non_image ? 1 : 0;

  return ret;
}